

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String * __thiscall Bstrlib::String::operator+=(String *this,int64 c)

{
  String *pSVar1;
  String local_28;
  int64 local_18;
  int64 c_local;
  String *this_local;
  
  local_18 = c;
  c_local = (int64)this;
  Print((char *)&local_28,"%lld",c);
  pSVar1 = operator+=(this,&local_28);
  ~String(&local_28);
  return pSVar1;
}

Assistant:

const String& String::operator +=(const int64 c)
    {
#ifndef HasFloatParsing
        char buffer[22] = { c < 0 ? '-': '\0' };
        Strings::ulltoa((uint64)(c < 0 ? -c : c), &buffer[c < 0 ? 1 : 0], 10);
        return *this += buffer;
#else
        return *this += String::Print(PF_LLD, c);
#endif
    }